

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagelayout.cpp
# Opt level: O2

void __thiscall QPageLayout::setUnits(QPageLayout *this,Unit units)

{
  QPageLayoutPrivate *pQVar1;
  long in_FS_OFFSET;
  QSizeF QVar2;
  QMarginsF local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->d).d.ptr)->m_units != units) {
    QExplicitlySharedDataPointer<QPageLayoutPrivate>::detach(&this->d);
    pQVar1 = (this->d).d.ptr;
    qt_convertMargins(&local_40,&pQVar1->m_margins,pQVar1->m_units,units);
    pQVar1 = (this->d).d.ptr;
    (pQVar1->m_margins).m_right = local_40.m_right;
    (pQVar1->m_margins).m_bottom = local_40.m_bottom;
    (pQVar1->m_margins).m_left = local_40.m_left;
    (pQVar1->m_margins).m_top = local_40.m_top;
    pQVar1 = (this->d).d.ptr;
    qt_convertMargins(&local_40,&pQVar1->m_minMargins,pQVar1->m_units,units);
    pQVar1 = (this->d).d.ptr;
    (pQVar1->m_minMargins).m_right = local_40.m_right;
    (pQVar1->m_minMargins).m_bottom = local_40.m_bottom;
    (pQVar1->m_minMargins).m_left = local_40.m_left;
    (pQVar1->m_minMargins).m_top = local_40.m_top;
    pQVar1 = (this->d).d.ptr;
    qt_convertMargins(&local_40,&pQVar1->m_maxMargins,pQVar1->m_units,units);
    pQVar1 = (this->d).d.ptr;
    (pQVar1->m_maxMargins).m_right = local_40.m_right;
    (pQVar1->m_maxMargins).m_bottom = local_40.m_bottom;
    (pQVar1->m_maxMargins).m_left = local_40.m_left;
    (pQVar1->m_maxMargins).m_top = local_40.m_top;
    pQVar1 = (this->d).d.ptr;
    pQVar1->m_units = units;
    QVar2 = QPageLayoutPrivate::fullSizeUnits(pQVar1,units);
    pQVar1 = (this->d).d.ptr;
    (pQVar1->m_fullSize).wd = QVar2.wd;
    (pQVar1->m_fullSize).ht = QVar2.ht;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPageLayout::setUnits(Unit units)
{
    if (units != d->m_units) {
        d.detach();
        d->m_margins = qt_convertMargins(d->m_margins, d->m_units, units);
        d->m_minMargins = qt_convertMargins(d->m_minMargins, d->m_units, units);
        d->m_maxMargins = qt_convertMargins(d->m_maxMargins, d->m_units, units);
        d->m_units = units;
        d->m_fullSize = d->fullSizeUnits(d->m_units);
    }
}